

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O3

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<16ul>
          (StringBuilder<Memory::ArenaAllocator> *this,char16 (*str) [16])

{
  if (this->length - this->count < 0x10) {
    ExtendBuffer(this,this->count + 0x10);
  }
  JavascriptString::CopyHelper(this->appendPtr,*str,0xf);
  this->appendPtr = this->appendPtr + 0xf;
  this->count = this->count + 0xf;
  return;
}

Assistant:

void AppendCppLiteral(const char16(&str)[N])
        {
            // Need to account for the terminating null character in C++ string literals, hence N > 2 and N - 1 below
            static_assert(N > 2, "Use Append(char16) for appending literal single characters and do not append empty string literal");
            Append(str, N - 1);
        }